

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

hash_entry_t * hash_detach_entry(adh_node_t *node)

{
  uint uVar1;
  hash_entry_t *local_28;
  hash_entry_t *entry;
  int hash_index;
  adh_node_t *node_local;
  
  uVar1 = hash_get_index(node->weight);
  local_28 = map_weight_nodes.buckets[(int)uVar1];
  while( true ) {
    if (local_28 == (hash_entry_t *)0x0) {
      return (hash_entry_t *)0x0;
    }
    if (local_28->value == node) break;
    local_28 = local_28->next;
  }
  if (local_28->prev == (hash_entry *)0x0) {
    map_weight_nodes.buckets[(int)uVar1] = local_28->next;
  }
  else {
    local_28->prev->next = local_28->next;
  }
  if (local_28->next != (hash_entry *)0x0) {
    local_28->next->prev = local_28->prev;
  }
  local_28->prev = (hash_entry *)0x0;
  local_28->next = (hash_entry *)0x0;
  return local_28;
}

Assistant:

hash_entry_t* hash_detach_entry(adh_node_t *node) {
    int hash_index = hash_get_index(node->weight);

    hash_entry_t  *entry = map_weight_nodes.buckets[hash_index];
    while(entry) {
        if(entry->value == node) {
            if(entry->prev == NULL) {
                map_weight_nodes.buckets[hash_index] = entry->next;
            }
            else {
                entry->prev->next = entry->next;
            }

            if(entry->next)
                entry->next->prev = entry->prev;

            entry->prev = NULL;
            entry->next = NULL;
            return entry;
        }
        entry = entry->next;
    }
    return NULL;
}